

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O2

void __thiscall
CodeGenGenericContext::KillUnreadRegVmRegister(CodeGenGenericContext *this,uchar regId)

{
  undefined7 in_register_00000031;
  x86Argument local_20;
  
  local_20.ptrNum = (int)CONCAT71(in_register_00000031,regId) << 3;
  local_20.type = argPtr;
  local_20.ptrBase = rEBX;
  local_20.ptrIndex = rNONE;
  local_20.ptrMult = 1;
  local_20.field_1.reg = local_20.type;
  MemKillDeadStore(this,&local_20);
  return;
}

Assistant:

void CodeGenGenericContext::KillUnreadRegVmRegister(unsigned char regId)
{
	MemKillDeadStore(x86Argument(sQWORD, rRBX, regId * 8));
}